

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

_Bool imap_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *resp)

{
  imapstate iVar1;
  IMAP *pIVar2;
  _Bool _Var3;
  int iVar4;
  char *__s;
  size_t __n;
  ulong uVar5;
  size_t id_len;
  char *id;
  imap_conn *imapc;
  IMAP *imap;
  int *resp_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pIVar2 = (data->req).p.imap;
  __s = (conn->proto).imapc.resptag;
  __n = strlen(__s);
  if (((len < __n + 1) || (iVar4 = memcmp(__s,line,__n), iVar4 != 0)) || (line[__n] != ' ')) {
    if ((len < 2) || (*(short *)line != 0x202a)) {
      if (((pIVar2 == (IMAP *)0x0) || (pIVar2->custom != (char *)0x0)) ||
         (((len != 3 || (*line != '+')) && ((len < 2 || (*(short *)line != 0x202b)))))) {
        data_local._7_1_ = false;
      }
      else {
        iVar1 = (conn->proto).imapc.state;
        if ((iVar1 == IMAP_AUTHENTICATE) || (iVar1 == IMAP_APPEND)) {
          *resp = 0x2b;
        }
        else {
          Curl_failf(data,"Unexpected continuation response");
          *resp = -1;
        }
        data_local._7_1_ = true;
      }
    }
    else {
      switch((conn->proto).imapc.state) {
      case IMAP_CAPABILITY:
        _Var3 = imap_matchresp(line,len,"CAPABILITY");
        if (!_Var3) {
          return false;
        }
        break;
      default:
        return false;
      case IMAP_LIST:
        if (((pIVar2->custom == (char *)0x0) && (_Var3 = imap_matchresp(line,len,"LIST"), !_Var3))
           || (((pIVar2->custom != (char *)0x0 &&
                (_Var3 = imap_matchresp(line,len,pIVar2->custom), !_Var3)) &&
               ((((((iVar4 = curl_strequal(pIVar2->custom,"STORE"), iVar4 == 0 ||
                    (_Var3 = imap_matchresp(line,len,"FETCH"), !_Var3)) &&
                   (iVar4 = curl_strequal(pIVar2->custom,"SELECT"), iVar4 == 0)) &&
                  ((iVar4 = curl_strequal(pIVar2->custom,"EXAMINE"), iVar4 == 0 &&
                   (iVar4 = curl_strequal(pIVar2->custom,"SEARCH"), iVar4 == 0)))) &&
                 (iVar4 = curl_strequal(pIVar2->custom,"EXPUNGE"), iVar4 == 0)) &&
                (((iVar4 = curl_strequal(pIVar2->custom,"LSUB"), iVar4 == 0 &&
                  (iVar4 = curl_strequal(pIVar2->custom,"UID"), iVar4 == 0)) &&
                 ((iVar4 = curl_strequal(pIVar2->custom,"GETQUOTAROOT"), iVar4 == 0 &&
                  (iVar4 = curl_strequal(pIVar2->custom,"NOOP"), iVar4 == 0)))))))))) {
          return false;
        }
        break;
      case IMAP_SELECT:
        break;
      case IMAP_FETCH:
        _Var3 = imap_matchresp(line,len,"FETCH");
        if (!_Var3) {
          return false;
        }
        break;
      case IMAP_SEARCH:
        _Var3 = imap_matchresp(line,len,"SEARCH");
        if (!_Var3) {
          return false;
        }
      }
      *resp = 0x2a;
      data_local._7_1_ = true;
    }
  }
  else {
    uVar5 = len - (__n + 1);
    if ((uVar5 < 2) || (*(short *)(line + __n + 1) != 0x4b4f)) {
      if ((uVar5 < 7) || (iVar4 = memcmp(line + __n + 1,"PREAUTH",7), iVar4 != 0)) {
        *resp = 2;
      }
      else {
        *resp = 3;
      }
    }
    else {
      *resp = 1;
    }
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

static bool imap_endofresp(struct Curl_easy *data, struct connectdata *conn,
                           const char *line, size_t len, int *resp)
{
  struct IMAP *imap = data->req.p.imap;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = IMAP_RESP_OK;
    else if(len >= 7 && !memcmp(line, "PREAUTH", 7))
      *resp = IMAP_RESP_PREAUTH;
    else
      *resp = IMAP_RESP_NOT_OK;

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (!strcasecompare(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           !strcasecompare(imap->custom, "SELECT") &&
           !strcasecompare(imap->custom, "EXAMINE") &&
           !strcasecompare(imap->custom, "SEARCH") &&
           !strcasecompare(imap->custom, "EXPUNGE") &&
           !strcasecompare(imap->custom, "LSUB") &&
           !strcasecompare(imap->custom, "UID") &&
           !strcasecompare(imap->custom, "GETQUOTAROOT") &&
           !strcasecompare(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some email servers ignore this and only send a single + instead. */
  if(imap && !imap->custom && ((len == 3 && line[0] == '+') ||
     (len >= 2 && !memcmp("+ ", line, 2)))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}